

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_complex_exp(sexp ctx,sexp z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  sexp psVar4;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  dVar1 = sexp_to_double(ctx,(z->value).type.name);
  dVar1 = exp(dVar1);
  dVar2 = sexp_to_double(ctx,(z->value).type.cpl);
  local_28.var = &local_30;
  local_30 = (sexp)0x43e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  local_30 = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)&DAT_00000001);
  dVar3 = cos(dVar2);
  psVar4 = sexp_make_flonum(ctx,dVar3 * dVar1);
  (local_30->value).type.name = psVar4;
  dVar2 = sin(dVar2);
  psVar4 = sexp_make_flonum(ctx,dVar2 * dVar1);
  (local_30->value).type.cpl = psVar4;
  (ctx->value).context.saves = local_28.next;
  return local_30;
}

Assistant:

sexp sexp_complex_exp (sexp ctx, sexp z) {
  double e2x = exp(sexp_to_double(ctx, sexp_complex_real(z))),
    y = sexp_to_double(ctx, sexp_complex_imag(z));
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(res) = sexp_make_flonum(ctx, e2x*cos(y));
  sexp_complex_imag(res) = sexp_make_flonum(ctx, e2x*sin(y));
  sexp_gc_release1(ctx);
  return res;
}